

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_calculation.cc
# Opt level: O2

bool __thiscall
sptk::HistogramCalculation::Run
          (HistogramCalculation *this,vector<double,_std::allocator<double>_> *data,
          vector<double,_std::allocator<double>_> *histogram)

{
  double dVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  pointer pdVar5;
  pointer pdVar6;
  ulong uVar7;
  pointer pdVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  
  if (this->is_valid_ != true) {
    return false;
  }
  bVar4 = false;
  if ((histogram != (vector<double,_std::allocator<double>_> *)0x0) &&
     (bVar4 = false,
     (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
     _M_start !=
     (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
     _M_finish)) {
    pdVar6 = (histogram->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (histogram->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar8 = pdVar6;
    if ((long)pdVar5 - (long)pdVar6 >> 3 != (long)this->num_bin_) {
      std::vector<double,_std::allocator<double>_>::resize(histogram,(long)this->num_bin_);
      pdVar6 = (histogram->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (histogram->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar8 = pdVar6;
    }
    for (; pdVar6 != pdVar5; pdVar6 = pdVar6 + 1) {
      *pdVar6 = 0.0;
    }
    pdVar6 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = (ulong)((long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar6) >> 3;
    iVar2 = this->num_bin_;
    uVar7 = 0;
    uVar10 = uVar9 & 0xffffffff;
    if ((int)uVar9 < 1) {
      uVar10 = uVar7;
    }
    for (; uVar10 != uVar7; uVar7 = uVar7 + 1) {
      dVar11 = this->upper_bound_;
      dVar1 = pdVar6[uVar7];
      if ((dVar1 < this->lower_bound_) || (dVar11 <= dVar1)) {
        if ((dVar11 == dVar1) && (lVar3 = (long)iVar2 + -1, !NAN(dVar11) && !NAN(dVar1)))
        goto LAB_00104fa7;
      }
      else {
        dVar11 = floor((dVar1 - this->lower_bound_) / this->bin_width_);
        lVar3 = (long)(int)dVar11;
LAB_00104fa7:
        pdVar8[lVar3] = pdVar8[lVar3] + 1.0;
      }
    }
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool HistogramCalculation::Run(const std::vector<double>& data,
                               std::vector<double>* histogram) const {
  // Check inputs.
  if (!is_valid_ || data.empty() || NULL == histogram) {
    return false;
  }

  // Prepare memories.
  if (histogram->size() != static_cast<std::size_t>(num_bin_)) {
    histogram->resize(num_bin_);
  }

  std::fill(histogram->begin(), histogram->end(), 0.0);

  const int length(static_cast<int>(data.size()));
  const double* input(&(data[0]));
  double* output(&((*histogram)[0]));
  for (int i(0); i < length; ++i) {
    if (lower_bound_ <= input[i] && input[i] < upper_bound_) {
      const int bin_index(
          static_cast<int>(std::floor((input[i] - lower_bound_) / bin_width_)));
      ++output[bin_index];
    } else if (upper_bound_ == input[i]) {
      ++output[num_bin_ - 1];
    }
  }

  return true;
}